

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_mipsdsp_multiply
               (DisasContext_conflict6 *ctx,uint32_t op1,uint32_t op2,int ret,int v1,int v2,
               int check_ret)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i32 ret_00;
  TCGv_i64 t;
  TCGv_i64 t_00;
  int ac;
  TCGv_i64 v2_t;
  TCGv_i64 v1_t;
  TCGv_i32 t0;
  TCGContext_conflict6 *tcg_ctx;
  int v2_local;
  int v1_local;
  int ret_local;
  uint32_t op2_local;
  uint32_t op1_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ret != 0) || (check_ret != 1)) {
    ret_00 = tcg_temp_new_i32(tcg_ctx_00);
    t = tcg_temp_new_i64(tcg_ctx_00);
    t_00 = tcg_temp_new_i64(tcg_ctx_00);
    tcg_gen_movi_i32(tcg_ctx_00,ret_00,ret);
    gen_load_gpr(tcg_ctx_00,t,v1);
    gen_load_gpr(tcg_ctx_00,t_00,v2);
    switch(op1) {
    case 0x7c000010:
      if (op2 == 0x7c000190) {
        check_dsp(ctx);
        gen_helper_muleu_s_ph_qbl(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0001d0) {
        check_dsp(ctx);
        gen_helper_muleu_s_ph_qbr(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000710) {
        check_dsp(ctx);
        gen_helper_muleq_s_w_phl(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000750) {
        check_dsp(ctx);
        gen_helper_muleq_s_w_phr(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000790) {
        check_dsp_r2(ctx);
        gen_helper_mulq_s_ph(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0007d0) {
        check_dsp(ctx);
        gen_helper_mulq_rs_ph(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      break;
    case 0x7c000014:
      if (op2 == 0x7c000194) {
        check_dsp(ctx);
        gen_helper_muleu_s_qh_obl(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0001d4) {
        check_dsp(ctx);
        gen_helper_muleu_s_qh_obr(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000714) {
        check_dsp(ctx);
        gen_helper_muleq_s_pw_qhl(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000754) {
        check_dsp(ctx);
        gen_helper_muleq_s_pw_qhr(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0007d4) {
        check_dsp(ctx);
        gen_helper_mulq_rs_qh(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      break;
    case 0x7c000018:
      check_dsp_r2(ctx);
      if (op2 == 0x7c000318) {
        gen_helper_mul_ph(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000398) {
        gen_helper_mul_s_ph(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000598) {
        gen_helper_mulq_s_w(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0005d8) {
        gen_helper_mulq_rs_w(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      break;
    case 0x7c000030:
      if (op2 == 0x7c000030) {
        check_dsp_r2(ctx);
        gen_helper_dpa_w_ph(tcg_ctx_00,ret_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000070) {
        check_dsp_r2(ctx);
        gen_helper_dps_w_ph(tcg_ctx_00,ret_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0000b0) {
        check_dsp_r2(ctx);
        gen_helper_mulsa_w_ph(tcg_ctx_00,ret_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0000f0) {
        check_dsp(ctx);
        gen_helper_dpau_h_qbl(tcg_ctx_00,ret_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000130) {
        check_dsp(ctx);
        gen_helper_dpaq_s_w_ph(tcg_ctx_00,ret_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000170) {
        check_dsp(ctx);
        gen_helper_dpsq_s_w_ph(tcg_ctx_00,ret_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0001b0) {
        check_dsp(ctx);
        gen_helper_mulsaq_s_w_ph(tcg_ctx_00,ret_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0001f0) {
        check_dsp(ctx);
        gen_helper_dpau_h_qbr(tcg_ctx_00,ret_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000230) {
        check_dsp_r2(ctx);
        gen_helper_dpax_w_ph(tcg_ctx_00,ret_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000270) {
        check_dsp_r2(ctx);
        gen_helper_dpsx_w_ph(tcg_ctx_00,ret_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0002f0) {
        check_dsp(ctx);
        gen_helper_dpsu_h_qbl(tcg_ctx_00,ret_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000330) {
        check_dsp(ctx);
        gen_helper_dpaq_sa_l_w(tcg_ctx_00,ret_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000370) {
        check_dsp(ctx);
        gen_helper_dpsq_sa_l_w(tcg_ctx_00,ret_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0003f0) {
        check_dsp(ctx);
        gen_helper_dpsu_h_qbr(tcg_ctx_00,ret_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000430) {
        check_dsp(ctx);
        gen_helper_maq_sa_w_phl(tcg_ctx_00,ret_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0004b0) {
        check_dsp(ctx);
        gen_helper_maq_sa_w_phr(tcg_ctx_00,ret_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000530) {
        check_dsp(ctx);
        gen_helper_maq_s_w_phl(tcg_ctx_00,ret_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0005b0) {
        check_dsp(ctx);
        gen_helper_maq_s_w_phr(tcg_ctx_00,ret_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000630) {
        check_dsp_r2(ctx);
        gen_helper_dpaqx_s_w_ph(tcg_ctx_00,ret_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000670) {
        check_dsp_r2(ctx);
        gen_helper_dpsqx_s_w_ph(tcg_ctx_00,ret_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0006b0) {
        check_dsp_r2(ctx);
        gen_helper_dpaqx_sa_w_ph(tcg_ctx_00,ret_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0006f0) {
        check_dsp_r2(ctx);
        gen_helper_dpsqx_sa_w_ph(tcg_ctx_00,ret_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      break;
    case 0x7c000034:
      tcg_gen_movi_i32(tcg_ctx_00,ret_00,ret & 3);
      if (op2 == 0x7c000034) {
        check_dsp_r2(ctx);
        gen_helper_dpa_w_qh(tcg_ctx_00,t,t_00,ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000074) {
        check_dsp_r2(ctx);
        gen_helper_dps_w_qh(tcg_ctx_00,t,t_00,ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0000f4) {
        check_dsp(ctx);
        gen_helper_dpau_h_obl(tcg_ctx_00,t,t_00,ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000134) {
        check_dsp(ctx);
        gen_helper_dpaq_s_w_qh(tcg_ctx_00,t,t_00,ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000174) {
        check_dsp(ctx);
        gen_helper_dpsq_s_w_qh(tcg_ctx_00,t,t_00,ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0001b4) {
        check_dsp(ctx);
        gen_helper_mulsaq_s_w_qh(tcg_ctx_00,t,t_00,ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0001f4) {
        check_dsp(ctx);
        gen_helper_dpau_h_obr(tcg_ctx_00,t,t_00,ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0002f4) {
        check_dsp(ctx);
        gen_helper_dpsu_h_obl(tcg_ctx_00,t,t_00,ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000334) {
        check_dsp(ctx);
        gen_helper_dpaq_sa_l_pw(tcg_ctx_00,t,t_00,ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000374) {
        check_dsp(ctx);
        gen_helper_dpsq_sa_l_pw(tcg_ctx_00,t,t_00,ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0003b4) {
        check_dsp(ctx);
        gen_helper_mulsaq_s_l_pw(tcg_ctx_00,t,t_00,ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0003f4) {
        check_dsp(ctx);
        gen_helper_dpsu_h_obr(tcg_ctx_00,t,t_00,ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000434) {
        check_dsp(ctx);
        gen_helper_maq_sa_w_qhll(tcg_ctx_00,t,t_00,ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000474) {
        check_dsp(ctx);
        gen_helper_maq_sa_w_qhlr(tcg_ctx_00,t,t_00,ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0004b4) {
        check_dsp(ctx);
        gen_helper_maq_sa_w_qhrl(tcg_ctx_00,t,t_00,ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0004f4) {
        check_dsp(ctx);
        gen_helper_maq_sa_w_qhrr(tcg_ctx_00,t,t_00,ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000534) {
        check_dsp(ctx);
        gen_helper_maq_s_w_qhll(tcg_ctx_00,t,t_00,ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000574) {
        check_dsp(ctx);
        gen_helper_maq_s_w_qhlr(tcg_ctx_00,t,t_00,ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0005b4) {
        check_dsp(ctx);
        gen_helper_maq_s_w_qhrl(tcg_ctx_00,t,t_00,ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0005f4) {
        check_dsp(ctx);
        gen_helper_maq_s_w_qhrr(tcg_ctx_00,t,t_00,ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000674) {
        check_dsp(ctx);
        gen_helper_dmadd(tcg_ctx_00,t,t_00,ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0006f4) {
        check_dsp(ctx);
        gen_helper_dmsub(tcg_ctx_00,t,t_00,ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000734) {
        check_dsp(ctx);
        gen_helper_maq_s_l_pwl(tcg_ctx_00,t,t_00,ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000774) {
        check_dsp(ctx);
        gen_helper_dmaddu(tcg_ctx_00,t,t_00,ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0007b4) {
        check_dsp(ctx);
        gen_helper_maq_s_l_pwr(tcg_ctx_00,t,t_00,ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0007f4) {
        check_dsp(ctx);
        gen_helper_dmsubu(tcg_ctx_00,t,t_00,ret_00,tcg_ctx_00->cpu_env);
      }
    }
    tcg_temp_free_i32(tcg_ctx_00,ret_00);
    tcg_temp_free_i64(tcg_ctx_00,t);
    tcg_temp_free_i64(tcg_ctx_00,t_00);
  }
  return;
}

Assistant:

static void gen_mipsdsp_multiply(DisasContext *ctx, uint32_t op1, uint32_t op2,
                                 int ret, int v1, int v2, int check_ret)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0;
    TCGv v1_t;
    TCGv v2_t;

    if ((ret == 0) && (check_ret == 1)) {
        /* Treat as NOP. */
        return;
    }

    t0 = tcg_temp_new_i32(tcg_ctx);
    v1_t = tcg_temp_new(tcg_ctx);
    v2_t = tcg_temp_new(tcg_ctx);

    tcg_gen_movi_i32(tcg_ctx, t0, ret);
    gen_load_gpr(tcg_ctx, v1_t, v1);
    gen_load_gpr(tcg_ctx, v2_t, v2);

    switch (op1) {
    /*
     * OPC_MULT_G_2E, OPC_ADDUH_QB_DSP, OPC_MUL_PH_DSP have
     * the same mask and op1.
     */
    case OPC_MULT_G_2E:
        check_dsp_r2(ctx);
        switch (op2) {
        case  OPC_MUL_PH:
            gen_helper_mul_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case  OPC_MUL_S_PH:
            gen_helper_mul_s_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULQ_S_W:
            gen_helper_mulq_s_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULQ_RS_W:
            gen_helper_mulq_rs_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        }
        break;
    case OPC_DPA_W_PH_DSP:
        switch (op2) {
        case OPC_DPAU_H_QBL:
            check_dsp(ctx);
            gen_helper_dpau_h_qbl(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPAU_H_QBR:
            check_dsp(ctx);
            gen_helper_dpau_h_qbr(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPSU_H_QBL:
            check_dsp(ctx);
            gen_helper_dpsu_h_qbl(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPSU_H_QBR:
            check_dsp(ctx);
            gen_helper_dpsu_h_qbr(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPA_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpa_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPAX_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpax_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPAQ_S_W_PH:
            check_dsp(ctx);
            gen_helper_dpaq_s_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPAQX_S_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpaqx_s_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPAQX_SA_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpaqx_sa_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPS_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dps_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPSX_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpsx_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPSQ_S_W_PH:
            check_dsp(ctx);
            gen_helper_dpsq_s_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPSQX_S_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpsqx_s_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPSQX_SA_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpsqx_sa_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULSAQ_S_W_PH:
            check_dsp(ctx);
            gen_helper_mulsaq_s_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPAQ_SA_L_W:
            check_dsp(ctx);
            gen_helper_dpaq_sa_l_w(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPSQ_SA_L_W:
            check_dsp(ctx);
            gen_helper_dpsq_sa_l_w(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MAQ_S_W_PHL:
            check_dsp(ctx);
            gen_helper_maq_s_w_phl(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MAQ_S_W_PHR:
            check_dsp(ctx);
            gen_helper_maq_s_w_phr(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MAQ_SA_W_PHL:
            check_dsp(ctx);
            gen_helper_maq_sa_w_phl(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MAQ_SA_W_PHR:
            check_dsp(ctx);
            gen_helper_maq_sa_w_phr(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULSA_W_PH:
            check_dsp_r2(ctx);
            gen_helper_mulsa_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        }
        break;
#ifdef TARGET_MIPS64
    case OPC_DPAQ_W_QH_DSP:
        {
            int ac = ret & 0x03;
            tcg_gen_movi_i32(tcg_ctx, t0, ac);

            switch (op2) {
            case OPC_DMADD:
                check_dsp(ctx);
                gen_helper_dmadd(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DMADDU:
                check_dsp(ctx);
                gen_helper_dmaddu(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DMSUB:
                check_dsp(ctx);
                gen_helper_dmsub(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DMSUBU:
                check_dsp(ctx);
                gen_helper_dmsubu(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPA_W_QH:
                check_dsp_r2(ctx);
                gen_helper_dpa_w_qh(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPAQ_S_W_QH:
                check_dsp(ctx);
                gen_helper_dpaq_s_w_qh(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPAQ_SA_L_PW:
                check_dsp(ctx);
                gen_helper_dpaq_sa_l_pw(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPAU_H_OBL:
                check_dsp(ctx);
                gen_helper_dpau_h_obl(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPAU_H_OBR:
                check_dsp(ctx);
                gen_helper_dpau_h_obr(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPS_W_QH:
                check_dsp_r2(ctx);
                gen_helper_dps_w_qh(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPSQ_S_W_QH:
                check_dsp(ctx);
                gen_helper_dpsq_s_w_qh(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPSQ_SA_L_PW:
                check_dsp(ctx);
                gen_helper_dpsq_sa_l_pw(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPSU_H_OBL:
                check_dsp(ctx);
                gen_helper_dpsu_h_obl(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPSU_H_OBR:
                check_dsp(ctx);
                gen_helper_dpsu_h_obr(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_S_L_PWL:
                check_dsp(ctx);
                gen_helper_maq_s_l_pwl(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_S_L_PWR:
                check_dsp(ctx);
                gen_helper_maq_s_l_pwr(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_S_W_QHLL:
                check_dsp(ctx);
                gen_helper_maq_s_w_qhll(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_SA_W_QHLL:
                check_dsp(ctx);
                gen_helper_maq_sa_w_qhll(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_S_W_QHLR:
                check_dsp(ctx);
                gen_helper_maq_s_w_qhlr(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_SA_W_QHLR:
                check_dsp(ctx);
                gen_helper_maq_sa_w_qhlr(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_S_W_QHRL:
                check_dsp(ctx);
                gen_helper_maq_s_w_qhrl(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_SA_W_QHRL:
                check_dsp(ctx);
                gen_helper_maq_sa_w_qhrl(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_S_W_QHRR:
                check_dsp(ctx);
                gen_helper_maq_s_w_qhrr(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_SA_W_QHRR:
                check_dsp(ctx);
                gen_helper_maq_sa_w_qhrr(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MULSAQ_S_L_PW:
                check_dsp(ctx);
                gen_helper_mulsaq_s_l_pw(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MULSAQ_S_W_QH:
                check_dsp(ctx);
                gen_helper_mulsaq_s_w_qh(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            }
        }
        break;
#endif
    case OPC_ADDU_QB_DSP:
        switch (op2) {
        case OPC_MULEU_S_PH_QBL:
            check_dsp(ctx);
            gen_helper_muleu_s_ph_qbl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULEU_S_PH_QBR:
            check_dsp(ctx);
            gen_helper_muleu_s_ph_qbr(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULQ_RS_PH:
            check_dsp(ctx);
            gen_helper_mulq_rs_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULEQ_S_W_PHL:
            check_dsp(ctx);
            gen_helper_muleq_s_w_phl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULEQ_S_W_PHR:
            check_dsp(ctx);
            gen_helper_muleq_s_w_phr(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULQ_S_PH:
            check_dsp_r2(ctx);
            gen_helper_mulq_s_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        }
        break;
#ifdef TARGET_MIPS64
    case OPC_ADDU_OB_DSP:
        switch (op2) {
        case OPC_MULEQ_S_PW_QHL:
            check_dsp(ctx);
            gen_helper_muleq_s_pw_qhl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULEQ_S_PW_QHR:
            check_dsp(ctx);
            gen_helper_muleq_s_pw_qhr(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULEU_S_QH_OBL:
            check_dsp(ctx);
            gen_helper_muleu_s_qh_obl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULEU_S_QH_OBR:
            check_dsp(ctx);
            gen_helper_muleu_s_qh_obr(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULQ_RS_QH:
            check_dsp(ctx);
            gen_helper_mulq_rs_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        }
        break;
#endif
    }

    tcg_temp_free_i32(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, v1_t);
    tcg_temp_free(tcg_ctx, v2_t);
}